

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncTaskManager.hpp
# Opt level: O1

void __thiscall sftm::CAsyncTaskManager::Stop(CAsyncTaskManager *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  timespec local_38;
  
  uVar1 = this->m_nWorkerCount;
  if ((ulong)uVar1 != 0) {
    lVar4 = 0;
    do {
      (&(this->m_workers)._M_elems[0].m_bStopping)[lVar4] = true;
      lVar4 = lVar4 + 0x20;
    } while ((ulong)uVar1 << 5 != lVar4);
  }
  if (this->m_nWorkerCount != 0) {
    uVar5 = 0;
    do {
      if ((this->m_workers)._M_elems[uVar5].m_bFinished == false) {
        do {
          local_38.tv_sec = 0;
          local_38.tv_nsec = 10000000;
          do {
            iVar2 = nanosleep(&local_38,&local_38);
            if (iVar2 != -1) break;
            piVar3 = __errno_location();
          } while (*piVar3 == 4);
          std::condition_variable::notify_all();
        } while ((this->m_workers)._M_elems[uVar5].m_bFinished != true);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_nWorkerCount);
  }
  return;
}

Assistant:

void Stop() noexcept
		{
			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
				m_workers[nWorker].Stop();

			for (std::uint32_t nWorker = 0; nWorker < m_nWorkerCount; nWorker++)
			{
				while (!m_workers[nWorker].IsFinished())
				{
					std::this_thread::sleep_for(std::chrono::milliseconds(10));
					m_cvWorkerIdle.notify_all();
				}
			}
		}